

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprAttachSubtrees(sqlite3 *db,Expr *pRoot,Expr *pLeft,Expr *pRight)

{
  int iVar1;
  
  if (pRoot == (Expr *)0x0) {
    if (pLeft != (Expr *)0x0) {
      sqlite3ExprDeleteNN(db,pLeft);
    }
    if (pRight != (Expr *)0x0) {
      sqlite3ExprDeleteNN(db,pRight);
      return;
    }
  }
  else {
    if (pRight == (Expr *)0x0) {
      iVar1 = 1;
    }
    else {
      pRoot->pRight = pRight;
      pRoot->flags = pRoot->flags | pRight->flags & 0x400208;
      iVar1 = pRight->nHeight + 1;
    }
    pRoot->nHeight = iVar1;
    if (pLeft != (Expr *)0x0) {
      pRoot->pLeft = pLeft;
      pRoot->flags = pRoot->flags | pLeft->flags & 0x400208;
      if (iVar1 <= pLeft->nHeight) {
        pRoot->nHeight = pLeft->nHeight + 1;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAttachSubtrees(
  sqlite3 *db,
  Expr *pRoot,
  Expr *pLeft,
  Expr *pRight
){
  if( pRoot==0 ){
    assert( db->mallocFailed );
    sqlite3ExprDelete(db, pLeft);
    sqlite3ExprDelete(db, pRight);
  }else{
    assert( ExprUseXList(pRoot) );
    assert( pRoot->x.pSelect==0 );
    if( pRight ){
      pRoot->pRight = pRight;
      pRoot->flags |= EP_Propagate & pRight->flags;
#if SQLITE_MAX_EXPR_DEPTH>0
      pRoot->nHeight = pRight->nHeight+1;
    }else{
      pRoot->nHeight = 1;
#endif
    }
    if( pLeft ){
      pRoot->pLeft = pLeft;
      pRoot->flags |= EP_Propagate & pLeft->flags;
#if SQLITE_MAX_EXPR_DEPTH>0
      if( pLeft->nHeight>=pRoot->nHeight ){
        pRoot->nHeight = pLeft->nHeight+1;
      }
#endif
    }
  }
}